

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

void __thiscall cornerstone::buffer::put(buffer *this,ulong val)

{
  uint uVar1;
  ulong uVar2;
  overflow_error *this_00;
  uint uVar3;
  long lVar4;
  buffer *pbVar5;
  long lStack_20;
  
  uVar1 = *(uint *)this;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = (ulong)*(uint *)(this + 4);
    if ((uVar3 & uVar1) - uVar2 < 8) goto LAB_00139d0f;
    lStack_20 = 8;
  }
  else {
    uVar2 = (ulong)(uVar1 >> 0x10);
    if ((uVar3 & uVar1) - uVar2 < 8) {
LAB_00139d0f:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"insufficient buffer to store int32");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    lStack_20 = 4;
  }
  pbVar5 = this + uVar2 + lStack_20;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
    *pbVar5 = SUB81(val >> ((byte)lVar4 & 0x3f),0);
    pbVar5 = pbVar5 + 1;
  }
  if (*(int *)this < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + 8;
  }
  else {
    *(short *)(this + 2) = (short)((uint)*(int *)this >> 0x10) + 8;
  }
  return;
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}